

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
* gtl::internal_btree::
  btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
  ::init_internal(btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                  *n,btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                     *parent)

{
  template_ElementType<1L> *ptVar1;
  
  init_leaf(n,parent,0xf);
  ptVar1 = btree_node<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>
           ::GetField<1l>((btree_node<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>
                           *)n);
  ptVar1[3] = '\0';
  btree_node<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>
  ::GetField<3l>((btree_node<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>
                  *)n);
  return n;
}

Assistant:

static btree_node *init_internal(btree_node *n, btree_node *parent) {
    init_leaf(n, parent, kNodeValues);
    // Set `max_count` to a sentinel value to indicate that this node is
    // internal.
    n->set_max_count(kInternalNodeMaxCount);
    absl::container_internal::SanitizerPoisonMemoryRegion(
        &n->mutable_child(0), (kNodeValues + 1) * sizeof(btree_node *));
    return n;
  }